

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O1

_Bool append_slay(_Bool **current,wchar_t pick)

{
  byte bVar1;
  slay_conflict *psVar2;
  _Bool _Var3;
  _Bool *p_Var4;
  int *piVar5;
  ulong uVar6;
  
  psVar2 = slays;
  p_Var4 = *current;
  bVar1 = z_info->slay_max;
  if (p_Var4 == (_Bool *)0x0) {
    p_Var4 = (_Bool *)mem_zalloc((ulong)bVar1);
    *current = p_Var4;
  }
  else if (1 < bVar1) {
    piVar5 = &slays[1].multiplier;
    uVar6 = 1;
    do {
      if ((p_Var4[uVar6] == true) && (_Var3 = same_monsters_slain((wchar_t)uVar6,pick), _Var3)) {
        if (psVar2[pick].multiplier <= *piVar5) {
          return false;
        }
        p_Var4[uVar6] = false;
        break;
      }
      uVar6 = uVar6 + 1;
      piVar5 = piVar5 + 0xe;
    } while (bVar1 != uVar6);
  }
  p_Var4[pick] = true;
  return true;
}

Assistant:

bool append_slay(bool **current, int pick)
{
	int i;
	struct slay *slay = &slays[pick];

	/* No existing slays means OK to add */
	if (!(*current)) {
		*current = mem_zalloc(z_info->slay_max * sizeof(bool));
		(*current)[pick] = true;
		return true;
	}

	/* Check the existing slays for base/flag matches */
	for (i = 1; i < z_info->slay_max; i++) {
		if ((*current)[i]) {
			/*
			 * If affecting the same creatures, check the multiplier
			 */
			if (same_monsters_slain(i, pick)) {
				/* Same multiplier or smaller, fail */
				if (slay->multiplier <= slays[i].multiplier)
					return false;

				/* Greater multiplier, replace and accept */
				(*current)[i] = false;
				(*current)[pick] = true;
				return true;
			}
		}
	}

	/* We can add the new one now */
	(*current)[pick] = true;

	return true;
}